

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argumentHandlers.h
# Opt level: O0

void __thiscall ArgumentHandlers::Arguments::Arguments(Arguments *this)

{
  undefined4 *in_RDI;
  allocator<char> local_29;
  string local_28 [8];
  allocator<char> *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffff0;
  
  std::__cxx11::string::string((string *)(in_RDI + 0x7a));
  *in_RDI = 0;
  *(undefined1 *)(in_RDI + 1) = 0;
  *(undefined8 *)(in_RDI + 2) = 0;
  in_RDI[4] = 0;
  *(undefined8 *)(in_RDI + 6) = 2;
  *(undefined8 *)(in_RDI + 8) = 3;
  *(undefined8 *)(in_RDI + 10) = 3;
  in_RDI[0xe] = 0xb;
  in_RDI[0xf] = 0;
  *(undefined8 *)(in_RDI + 0x10) = 2;
  in_RDI[0x12] = 0;
  *(undefined8 *)(in_RDI + 0x14) = 0;
  *(undefined8 *)(in_RDI + 0x16) = 0;
  in_RDI[0x18] = 0;
  *(undefined1 *)(in_RDI + 0x19) = 0;
  *(undefined1 *)((long)in_RDI + 0x65) = 0;
  in_RDI[0x1a] = 0;
  in_RDI[0x1b] = 0;
  *(undefined8 *)(in_RDI + 0x1c) = 0xbff0000000000000;
  in_RDI[0x1e] = 2;
  *(undefined1 *)(in_RDI + 0x1f) = 0;
  in_RDI[0x20] = 1;
  *(undefined8 *)(in_RDI + 0x22) = 0;
  in_RDI[0x24] = 0;
  *(undefined8 *)(in_RDI + 0x26) = 0;
  in_RDI[0x28] = 0;
  in_RDI[0x39] = 10;
  in_RDI[0x29] = 1;
  in_RDI[0x2a] = 0;
  in_RDI[0x2b] = 0;
  in_RDI[0x2c] = 0;
  *(undefined1 *)(in_RDI + 0x2d) = 0;
  *(undefined1 *)((long)in_RDI + 0xb5) = 1;
  *(undefined8 *)(in_RDI + 0x2e) = 0;
  *(undefined8 *)(in_RDI + 0x30) = 0;
  in_RDI[0x32] = 0;
  in_RDI[0x33] = 0;
  *(undefined8 *)(in_RDI + 0x34) = 0;
  *(undefined8 *)(in_RDI + 0x36) = 0;
  in_RDI[0x38] = 1;
  in_RDI[0x3a] = 0;
  in_RDI[0x3b] = 0;
  in_RDI[0x3c] = 0;
  in_RDI[0x3d] = 0;
  in_RDI[0x3e] = 0;
  in_RDI[0x40] = 10;
  in_RDI[0x41] = 0;
  in_RDI[0x42] = 0;
  in_RDI[0x3f] = 0;
  in_RDI[0x43] = 0;
  *(undefined8 *)(in_RDI + 0x44) = 0x3fb999999999999a;
  in_RDI[0x46] = 0;
  in_RDI[0x47] = 2;
  *(undefined8 *)(in_RDI + 0x48) = 0xbff0000000000000;
  *(undefined8 *)(in_RDI + 0x4a) = 0xbff0000000000000;
  in_RDI[0x4c] = 0xffffffff;
  in_RDI[0x4d] = 0;
  in_RDI[0x4e] = 0xb;
  *(undefined8 *)(in_RDI + 0x50) = 0;
  in_RDI[0x52] = 2;
  in_RDI[0x53] = 0;
  *(undefined1 *)(in_RDI + 0x54) = 1;
  *(undefined1 *)((long)in_RDI + 0x151) = 1;
  *(undefined1 *)((long)in_RDI + 0x152) = 1;
  *(undefined8 *)(in_RDI + 0x56) = 200;
  in_RDI[0x58] = 1000;
  in_RDI[0x59] = 0x2a;
  *(undefined8 *)(in_RDI + 0x5a) = 0xbff0000000000000;
  in_RDI[0x5c] = 0;
  in_RDI[0x5d] = 0;
  in_RDI[0x5e] = 0;
  *(undefined8 *)(in_RDI + 0x60) = 10;
  *(undefined8 *)(in_RDI + 0x62) = 0x32;
  *(undefined8 *)(in_RDI + 100) = 0x32;
  *(undefined8 *)(in_RDI + 0x66) = 10;
  *(undefined1 *)(in_RDI + 0x68) = 1;
  *(undefined8 *)(in_RDI + 0x6a) = 0x3fd3333333333333;
  *(undefined8 *)(in_RDI + 0x6c) = 100;
  in_RDI[0x6e] = 10;
  in_RDI[0x6f] = 10000;
  in_RDI[0x70] = 10;
  in_RDI[0x71] = 0;
  *(undefined8 *)(in_RDI + 0x72) = 0x19;
  *(undefined8 *)(in_RDI + 0x74) = 0;
  *(undefined8 *)(in_RDI + 0x76) = 0x3fe0000000000000;
  *(undefined8 *)(in_RDI + 0x78) = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x7a),local_28);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator(&local_29);
  in_RDI[0x82] = 0;
  *(undefined1 *)(in_RDI + 0x83) = 0;
  *(undefined1 *)((long)in_RDI + 0x20d) = 1;
  *(undefined8 *)(in_RDI + 0x84) = 0;
  in_RDI[0x86] = 0xffffffff;
  in_RDI[0x87] = 0xffffffff;
  *(undefined1 *)(in_RDI + 0x88) = 0;
  *(undefined1 *)((long)in_RDI + 0x221) = 0;
  *(undefined1 *)((long)in_RDI + 0x222) = 0;
  *(undefined8 *)(in_RDI + 0x8a) = 0;
  in_RDI[0x8c] = 0xffffffff;
  in_RDI[0x8d] = 0;
  return;
}

Assistant:

Arguments()
    {
        // general
        verbose = 0;
        testMode = false;

        // problem file
        dpf = 0;
        problem_type = PARSE;
        nrAgents = 2;
        nrHouses = 3;
        nrFLs = 3;
        islandConf = ProblemAloha::InLine;
        alohaVariation = ProblemAloha::NoNewPacket;
        maxBacklog = 2;

        // output
        dryrun = 0;
        description = NULL;
        prefix = NULL;
        noReCompute = 0;
        outputPolicy = false;

        // model
        cache_flat_models = false;
        sparse = 0;
        isTOI = 0;
        discount = -1;

        // solution method
        horizon = 2;
        infiniteHorizon = false;
        nrRestarts = 1;

        // jpol index
        jpolIndex = 0;

        // BGSolver options
        bgsolver = BFS;
        deadline = 0;

        // GMAA
        gmaa = MAAstar;
        nrAMRestarts = 10;
        k = 1;
        saveAllBGs = 0;
        saveTimings = 0; // also used for Perseus
        useQcache = 0;
        requireQcache = false;
        exactBGs = true;
        slack = 0.0;
        GMAAdeadline = 0;

        // GMAA Cluster
        useBGclustering = 0;
        BGClusterAlgorithm = 0;
        thresholdJB = 0;
        thresholdPjaoh = 0;

        //JESP options
        jesp = JESPDP;

        // Perseus
        savePOMDP = 0;
        saveIntermediateV = 0;
        minimumNrIterations = 0;
        initializeWithImmediateReward = 0;
        initializeWithZero = 0;

        // Perseus belief set sampling options
        nrBeliefs = 10;
        saveBeliefs = 0;
        resetAfter = 0;
        uniqueBeliefs = 0;
        useQMDPforSamplingBeliefs = 0;
        QMDPexploreProb = 0.1;

        // PerseusBackup
        backup = POMDP;
        bgBackup = BGIP_SOLVER_EXHAUSTIVE;
        waitPenalty = -1;
        weight = -1;
        commModel = -1;
        computeVectorForEachBelief = 0;

        // Qheur options
        qheur = eQheurUndefined;
        QHybridHorizonLastTimeSteps = 0;
        QHybridFirstTS = eQBG;
        QHybridLastTS = eQMDP;
        TreeIPpruneAfterUnion = true;
        TreeIPpruneAfterCrossSum = true;
        TreeIPuseVectorCache = true;
        acceleratedPruningThreshold = 200;

        // Simulation options
        nrRuns = 1000;
        randomSeed = 42;
        successfulCommProb = -1;

        // TOI options
        TOIpolicy = 0;

        // TOIcentralized options
        TOIcentralized = 0;
        useCentralizedModels = 0;

        // CE (cross-entropy) options 
        nrCERestarts = 10;
        nrCEIterations = 50;
        nrCESamples = 50;
        nrCESamplesForUpdate = 10;
        CE_use_hard_threshold = 1; //(gamma in CE papers)
        CE_alpha = 0.3; //the learning rate
        nrCEEvaluationRuns = 100; // number of policy evaluation runs. 0 = exact evaluation

        // online POMDP 
        nrNodesExpanded = 10;

        // RL options;
        nrRLruns=10000;
        nrIntermediateEvaluations=10;
        startAtRLrun=0;
        // options for max-plus
        maxplus_maxiter = 25;
        maxplus_verbose = 0;
        maxplus_damping = 0.5;
        maxplus_nrRestarts = 1;
        maxplus_updateT = std::string("PARALL");

        BnBJointTypeOrdering = IdentityMapping;
        BnB_keepAll = false;
        BnB_consistentCompleteInformationHeur = true;

        // solveBG options
        bgFilename = 0;
        startIndex = -1;
        endIndex = -1;
        useASCIIformat = false;
        isCGBG = false;

        // Event-Driven POMDP options
        marginalize = false;
        marginalizationIndex = false;
        falseNegativeObs = -1;

        mmdp_method = ValueIteration;
    }